

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file_handle.cpp
# Opt level: O0

void __thiscall
SplitFixture_Uint16Max_Test<const_unsigned_char>::SplitFixture_Uint16Max_Test
          (SplitFixture_Uint16Max_Test<const_unsigned_char> *this)

{
  SplitFixture_Uint16Max_Test<const_unsigned_char> *this_local;
  
  anon_unknown.dwarf_60765::SplitFixture<const_unsigned_char>::SplitFixture
            (&this->super_SplitFixture<const_unsigned_char>);
  (this->super_SplitFixture<const_unsigned_char>).super_Test._vptr_Test =
       (_func_int **)&PTR__SplitFixture_Uint16Max_Test_002ac0c0;
  return;
}

Assistant:

TYPED_TEST (SplitFixture, Uint16Max) {
    constexpr std::size_t size = std::numeric_limits<std::uint16_t>::max ();
    auto buffer = std::make_unique<TypeParam[]> (size);

    using ::testing::Return;
    EXPECT_CALL (this->callback, call (buffer.get (), size)).Times (1).WillOnce (Return (size));

    using pstore::file::details::split;
    std::size_t const total = split<std::uint16_t> (buffer.get (), size, this->callback);
    EXPECT_EQ (size, total);
}